

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

void mk_http_request_free(mk_http_request *sr,mk_server *server)

{
  mk_server *server_local;
  mk_http_request *sr_local;
  
  mk_vhost_close(sr,server);
  if ((sr->headers).location != (char *)0x0) {
    mk_mem_free((sr->headers).location);
  }
  if ((sr->uri_processed).data != (sr->uri).data) {
    mk_ptr_free(&sr->uri_processed);
  }
  if ((sr->real_path).data != sr->real_path_static) {
    mk_ptr_free(&sr->real_path);
  }
  if ((sr->stream).channel != (mk_channel *)0x0) {
    mk_stream_release(&sr->stream);
  }
  return;
}

Assistant:

void mk_http_request_free(struct mk_http_request *sr, struct mk_server *server)
{
    /* Let the vhost interface to handle the session close */
    mk_vhost_close(sr, server);

    if (sr->headers.location) {
        mk_mem_free(sr->headers.location);
    }

    if (sr->uri_processed.data != sr->uri.data) {
        mk_ptr_free(&sr->uri_processed);
    }

    if (sr->real_path.data != sr->real_path_static) {
        mk_ptr_free(&sr->real_path);
    }

    if (sr->stream.channel) {
        mk_stream_release(&sr->stream);
    }
}